

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O2

size_t __thiscall
cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_prune
          (ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,time_point now)

{
  const_iterator __first;
  size_t sVar1;
  const_iterator __last;
  
  sVar1 = 0;
  __first._M_node =
       (this->m_ttl_list).
       super__List_base<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  for (__last._M_node = __first._M_node;
      (__last._M_node != (_List_node_base *)&this->m_ttl_list &&
      ((long)__last._M_node[1]._M_next <= (long)now.__d.__r));
      __last._M_node = (__last._M_node)->_M_next) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>>>
                        *)&this->m_keyed_elements,(_Base_ptr)__last._M_node[1]._M_prev);
    sVar1 = sVar1 + 1;
  }
  if (__last._M_node != __first._M_node) {
    std::__cxx11::
    list<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
    ::erase(&this->m_ttl_list,__first,__last);
  }
  return sVar1;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> size_t
    {
        const auto   ttl_begin = m_ttl_list.begin();
        const auto   ttl_end   = m_ttl_list.end();
        ttl_iterator ttl_iter;
        size_t       deleted{0};

        // Delete the keyed elements from the map. Not using do_erase to take
        // advantage of iterator range delete for TTLs.
        for (ttl_iter = ttl_begin; ttl_iter != ttl_end && now >= ttl_iter->m_expire_time; ++ttl_iter)
        {
            m_keyed_elements.erase(ttl_iter->m_keyed_elements_position);
            ++deleted;
        }

        // Delete the range of TTLs.
        if (ttl_iter != ttl_begin)
        {
            m_ttl_list.erase(ttl_begin, ttl_iter);
        }

        return deleted;
    }